

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Code _colourCode;
  undefined4 extraout_var;
  ostream *poVar4;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  reference this;
  Column *pCVar5;
  ulong uVar6;
  size_type sVar7;
  allocator local_221;
  string local_220;
  pluralise local_200;
  allocator local_1d1;
  string local_1d0;
  pluralise local_1b0;
  string local_188;
  Column local_168;
  Column local_138;
  undefined1 local_108 [8];
  string description;
  Column local_c8;
  Column local_98;
  Colour local_65 [8];
  Colour colourGuard;
  Code colour;
  TestCase *testCaseInfo;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec *testSpec;
  Config *config_local;
  
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  uVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) == 0) {
    poVar4 = cout();
    std::operator<<(poVar4,"All available test cases:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<(poVar4,"Matching test cases:\n");
  }
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1,testCases,
              (TestSpec *)
              matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&config->super_IConfig);
  __end1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                     ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  testCaseInfo = (TestCase *)
                 clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                           ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                     *)&testCaseInfo), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator*(&__end1);
    bVar1 = TestCaseInfo::isHidden(&this->super_TestCaseInfo);
    _colourCode = None;
    if (bVar1) {
      _colourCode = FileName;
    }
    Colour::Colour(local_65,_colourCode);
    poVar4 = cout();
    clara::TextFlow::Column::Column(&local_98,(string *)this);
    pCVar5 = clara::TextFlow::Column::initialIndent(&local_98,2);
    pCVar5 = clara::TextFlow::Column::indent(pCVar5,4);
    poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
    std::operator<<(poVar4,"\n");
    clara::TextFlow::Column::~Column(&local_98);
    iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])();
    if (1 < iVar2) {
      poVar4 = cout();
      Detail::stringify<Catch::SourceLineInfo>
                ((string *)((long)&description.field_2 + 8),&(this->super_TestCaseInfo).lineInfo);
      clara::TextFlow::Column::Column(&local_c8,(string *)((long)&description.field_2 + 8));
      pCVar5 = clara::TextFlow::Column::indent(&local_c8,4);
      poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column(&local_c8);
      std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)local_108,(string *)&(this->super_TestCaseInfo).description);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_108,"(NO DESCRIPTION)");
      }
      poVar4 = cout();
      clara::TextFlow::Column::Column(&local_138,(string *)local_108);
      pCVar5 = clara::TextFlow::Column::indent(&local_138,4);
      poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      clara::TextFlow::Column::~Column(&local_138);
      std::__cxx11::string::~string((string *)local_108);
    }
    bVar1 = clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->super_TestCaseInfo).tags);
    if (!bVar1) {
      poVar4 = cout();
      TestCaseInfo::tagsAsString_abi_cxx11_(&local_188,&this->super_TestCaseInfo);
      clara::TextFlow::Column::Column(&local_168,&local_188);
      pCVar5 = clara::TextFlow::Column::indent(&local_168,6);
      poVar4 = clara::TextFlow::operator<<(poVar4,pCVar5);
      std::operator<<(poVar4,"\n");
      clara::TextFlow::Column::~Column(&local_168);
      std::__cxx11::string::~string((string *)&local_188);
    }
    Colour::~Colour(local_65);
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&__end1);
  }
  uVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
  if ((uVar3 & 1) == 0) {
    poVar4 = cout();
    sVar7 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                      ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"test case",&local_1d1);
    pluralise::pluralise(&local_1b0,sVar7,&local_1d0);
    poVar4 = operator<<(poVar4,&local_1b0);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  else {
    poVar4 = cout();
    sVar7 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                      ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"matching test case",&local_221);
    pluralise::pluralise(&local_200,sVar7,&local_220);
    poVar4 = operator<<(poVar4,&local_200);
    poVar4 = std::operator<<(poVar4,'\n');
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
  }
  sVar7 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size
                    ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&__range1);
  return sVar7;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
        }

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Column( testCaseInfo.name ).initialIndent( 2 ).indent( 4 ) << "\n";
            if( config.verbosity() >= Verbosity::High ) {
                Catch::cout() << Column( Catch::Detail::stringify( testCaseInfo.lineInfo ) ).indent(4) << std::endl;
                std::string description = testCaseInfo.description;
                if( description.empty() )
                    description = "(NO DESCRIPTION)";
                Catch::cout() << Column( description ).indent(4) << std::endl;
            }
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Column( testCaseInfo.tagsAsString() ).indent( 6 ) << "\n";
        }

        if( !config.hasTestFilters() )
            Catch::cout() << pluralise( matchedTestCases.size(), "test case" ) << '\n' << std::endl;
        else
            Catch::cout() << pluralise( matchedTestCases.size(), "matching test case" ) << '\n' << std::endl;
        return matchedTestCases.size();
    }